

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deThreadTest.c
# Opt level: O2

void deSingleton_selfTest(void)

{
  int size;
  undefined4 uVar1;
  uint uVar2;
  uint uVar3;
  deBool dVar4;
  uint uVar5;
  deMemPool *pdVar6;
  deThread dVar7;
  uint uVar8;
  uint uVar9;
  dePoolArray *arr;
  bool bVar10;
  undefined4 local_44;
  long local_40;
  deMemPool *local_38;
  
  local_40 = 0;
  do {
    if (local_40 == 7) {
      return;
    }
    uVar1 = (&DAT_00105824)[local_40 * 3];
    uVar8 = 0;
    uVar2 = (&DAT_00105820)[local_40 * 3];
    if ((int)(&DAT_00105820)[local_40 * 3] < 1) {
      uVar2 = uVar8;
    }
    uVar3 = (&DAT_00105828)[local_40 * 3];
    if ((int)(&DAT_00105828)[local_40 * 3] < 1) {
      uVar3 = uVar8;
    }
LAB_0010371b:
    if (uVar8 != uVar3) {
      local_44 = uVar1;
      pdVar6 = deMemPool_createRoot((deMemPoolUtil *)0x0,0);
      arr = (dePoolArray *)0x0;
      if (pdVar6 != (deMemPool *)0x0) {
        arr = dePoolArray_create(pdVar6,8);
      }
      s_testSingleton = DE_SINGLETON_STATE_NOT_INITIALIZED;
      s_testSingletonInitCount = 0;
      s_testSingletonInitialized = '\0';
      s_singletonInitLock = 0;
      local_38 = pdVar6;
      uVar9 = uVar2;
LAB_00103779:
      do {
        bVar10 = uVar9 == 0;
        uVar9 = uVar9 - 1;
        if (bVar10) goto code_r0x0010380c;
        dVar7 = deThread_create(singletonTestThread,&local_44,(deThreadAttributes *)0x0);
        if (dVar7 == 0) {
          deAssertFail("thread",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                       ,0x27e);
        }
        uVar5 = arr->numElements;
        size = uVar5 + 1;
        if (arr->capacity < size) {
          dVar4 = dePoolArray_reserve(arr,size);
          if (dVar4 == 0) {
            deAssertFail("deThreadArray_pushBack(threads, thread)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                         ,0x27f);
            goto LAB_00103779;
          }
          uVar5 = arr->numElements;
          size = uVar5 + 1;
        }
        arr->numElements = size;
        *(deThread *)((long)arr->pageTable[(int)uVar5 >> 4] + (ulong)(uVar5 & 0xf) * 8) = dVar7;
      } while( true );
    }
    local_40 = local_40 + 1;
  } while( true );
code_r0x0010380c:
  s_singletonInitLock = 1;
  for (uVar9 = 0; uVar2 != uVar9; uVar9 = uVar9 + 1) {
    dVar7 = *(deThread *)((long)arr->pageTable[uVar9 >> 4] + (ulong)(uVar9 & 0xf) * 8);
    dVar4 = deThread_join(dVar7);
    if (dVar4 == 0) {
      deAssertFail("deThread_join(thread)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                   ,0x28a);
    }
    deThread_destroy(dVar7);
  }
  if (s_testSingletonInitialized == '\0') {
    deAssertFail("s_testSingletonInitialized",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                 ,0x28f);
  }
  pdVar6 = local_38;
  if (s_testSingletonInitCount != 1) {
    deAssertFail("s_testSingletonInitCount == 1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                 ,0x290);
  }
  deMemPool_destroy(pdVar6);
  uVar8 = uVar8 + 1;
  goto LAB_0010371b;
}

Assistant:

void deSingleton_selfTest (void)
{
	const struct
	{
		int		numThreads;
		int		initTimeMs;
		int		repeatCount;
	} cases[] =
	{
	/*	#threads	time	#repeat	*/
		{ 1,		-1,		5	},
		{ 1,		1,		5	},
		{ 2,		-1,		20	},
		{ 2,		1,		20	},
		{ 4,		-1,		20	},
		{ 4,		1,		20	},
		{ 4,		5,		20	}
	};
	int caseNdx;

	for (caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
	{
		int		numThreads		= cases[caseNdx].numThreads;
		int		initTimeMs		= cases[caseNdx].initTimeMs;
		int		repeatCount		= cases[caseNdx].repeatCount;
		int		subCaseNdx;

		for (subCaseNdx = 0; subCaseNdx < repeatCount; subCaseNdx++)
			runSingletonThreadedTest(numThreads, initTimeMs);
	}
}